

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_reinit_feat(acmod_t *acmod,fe_t *fe,feat_t *fcb)

{
  agc_t *agc;
  cmn_t *cmn;
  int iVar1;
  cmn_type_t cmn_00;
  agc_type_t agc_00;
  int32 iVar2;
  fe_t *fe_00;
  feat_t *feat;
  char *pcVar3;
  char *pcVar4;
  int32 **subvecs;
  mfcc_t **ppmVar5;
  long lVar6;
  mfcc_t ***pppmVar7;
  long *plVar8;
  double dVar9;
  
  if (fe == (fe_t *)0x0) {
    fe_00 = fe_init_auto_r(acmod->config);
    if (fe_00 == (fe_t *)0x0) {
      return -1;
    }
  }
  else {
    fe_00 = fe_retain(fe);
  }
  iVar1 = acmod_fe_mismatch(acmod,fe_00);
  if (iVar1 == 0) {
    if (acmod->fe != (fe_t *)0x0) {
      fe_free(acmod->fe);
    }
    acmod->fe = fe_00;
    if (fcb == (feat_t *)0x0) {
      pcVar3 = ps_config_str(acmod->config,"feat");
      pcVar4 = ps_config_str(acmod->config,"cmn");
      cmn_00 = cmn_type_from_str(pcVar4);
      iVar1 = ps_config_bool(acmod->config,"varnorm");
      pcVar4 = ps_config_str(acmod->config,"agc");
      agc_00 = agc_type_from_str(pcVar4);
      lVar6 = ps_config_int(acmod->config,"ceplen");
      feat = feat_init(pcVar3,cmn_00,iVar1,agc_00,1,(int32)lVar6);
      if (feat == (feat_t *)0x0) {
        return -1;
      }
      pcVar3 = ps_config_str(acmod->config,"lda");
      if (pcVar3 != (char *)0x0) {
        pcVar3 = ps_config_str(acmod->config,"lda");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0xa4,"Reading linear feature transformation from %s\n",pcVar3);
        pcVar3 = ps_config_str(acmod->config,"lda");
        lVar6 = ps_config_int(acmod->config,"ldadim");
        iVar2 = feat_read_lda(feat,pcVar3,(int32)lVar6);
        if (iVar2 < 0) {
          return -1;
        }
      }
      pcVar3 = ps_config_str(acmod->config,"svspec");
      if (pcVar3 != (char *)0x0) {
        pcVar3 = ps_config_str(acmod->config,"svspec");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0xae,"Using subvector specification %s\n",pcVar3);
        pcVar3 = ps_config_str(acmod->config,"svspec");
        subvecs = parse_subvecs(pcVar3);
        if (subvecs == (int32 **)0x0) {
          return -1;
        }
        iVar1 = feat_set_subvecs(feat,subvecs);
        if (iVar1 < 0) {
          return -1;
        }
      }
      pcVar3 = ps_config_str(acmod->config,"agc");
      iVar1 = strcmp(pcVar3,"none");
      if (iVar1 != 0) {
        agc = feat->agc_struct;
        dVar9 = ps_config_float(acmod->config,"agcthresh");
        agc_set_threshold(agc,(float32)(float)dVar9);
      }
      if ((feat->cmn_struct != (cmn_t *)0x0) &&
         (pcVar3 = ps_config_str(acmod->config,"cmninit"), pcVar3 != (char *)0x0)) {
        pcVar3 = ps_config_str(acmod->config,"cmninit");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                ,0xbc,"Setting initial CMN to %s\n",pcVar3);
        cmn = feat->cmn_struct;
        pcVar3 = ps_config_str(acmod->config,"cmninit");
        cmn_set_repr(cmn,pcVar3);
      }
    }
    else {
      feat = feat_retain(fcb);
    }
    iVar1 = acmod_feat_mismatch(acmod,feat);
    if (iVar1 == 0) {
      if (acmod->fcb != (feat_t *)0x0) {
        feat_free(acmod->fcb);
      }
      acmod->fcb = feat;
      acmod->n_mfc_alloc = feat->window_size * 2 + 1;
      if (acmod->mfc_buf != (mfcc_t **)0x0) {
        ckd_free_2d(acmod->mfc_buf);
      }
      ppmVar5 = (mfcc_t **)
                __ckd_calloc_2d__((long)acmod->n_mfc_alloc,(long)acmod->fcb->cepsize,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                  ,0xcf);
      acmod->mfc_buf = ppmVar5;
      iVar1 = acmod->n_mfc_alloc;
      lVar6 = ps_config_int(acmod->config,"pl_window");
      acmod->n_feat_alloc = (int)lVar6 + iVar1;
      if (acmod->feat_buf != (mfcc_t ***)0x0) {
        feat_array_free(acmod->feat_buf);
      }
      pppmVar7 = feat_array_alloc(acmod->fcb,acmod->n_feat_alloc);
      acmod->feat_buf = pppmVar7;
      if (acmod->framepos != (long *)0x0) {
        ckd_free(acmod->framepos);
      }
      plVar8 = (long *)__ckd_calloc__((long)acmod->n_feat_alloc,8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                      ,0xd8);
      acmod->framepos = plVar8;
      return 0;
    }
    feat_free(feat);
  }
  else {
    fe_free(fe_00);
  }
  return -1;
}

Assistant:

int
acmod_reinit_feat(acmod_t *acmod, fe_t *fe, feat_t *fcb)
{
    if (fe)
        fe = fe_retain(fe);
    else {
        fe = fe_init_auto_r(acmod->config);
        if (fe == NULL)
            return -1;
    }
    if (acmod_fe_mismatch(acmod, fe)) {
        fe_free(fe);
        return -1;
    }
    if (acmod->fe)
        fe_free(acmod->fe);
    acmod->fe = fe;

    if (fcb)
        fcb = feat_retain(fcb);
    else {
        fcb =
            feat_init(ps_config_str(acmod->config, "feat"),
                      cmn_type_from_str(ps_config_str(acmod->config,"cmn")),
                      ps_config_bool(acmod->config, "varnorm"),
                      agc_type_from_str(ps_config_str(acmod->config, "agc")),
                      1, ps_config_int(acmod->config, "ceplen"));
        if (fcb == NULL)
            return -1;

        if (ps_config_str(acmod->config, "lda")) {
            E_INFO("Reading linear feature transformation from %s\n",
                   ps_config_str(acmod->config, "lda"));
            if (feat_read_lda(fcb,
                              ps_config_str(acmod->config, "lda"),
                              ps_config_int(acmod->config, "ldadim")) < 0)
                return -1;
        }

        if (ps_config_str(acmod->config, "svspec")) {
            int32 **subvecs;
            E_INFO("Using subvector specification %s\n",
                   ps_config_str(acmod->config, "svspec"));
            if ((subvecs = parse_subvecs(ps_config_str(acmod->config, "svspec"))) == NULL)
                return -1;
            if ((feat_set_subvecs(fcb, subvecs)) < 0)
                return -1;
        }

        if (0 != strcmp(ps_config_str(acmod->config, "agc"), "none")) {
            agc_set_threshold(fcb->agc_struct,
                              ps_config_float(acmod->config, "agcthresh"));
        }

        if (fcb->cmn_struct
            && ps_config_str(acmod->config, "cmninit")) {
            E_INFO("Setting initial CMN to %s\n", ps_config_str(acmod->config, "cmninit"));
            cmn_set_repr(fcb->cmn_struct, ps_config_str(acmod->config, "cmninit"));
        }
    }
    if (acmod_feat_mismatch(acmod, fcb)) {
        feat_free(fcb);
        return -1;
    }
    if (acmod->fcb)
        feat_free(acmod->fcb);
    acmod->fcb = fcb;

    /* The MFCC buffer needs to be at least as large as the dynamic
     * feature window.  */
    acmod->n_mfc_alloc = acmod->fcb->window_size * 2 + 1;
    if (acmod->mfc_buf)
        ckd_free_2d(acmod->mfc_buf);
    acmod->mfc_buf = (mfcc_t **)
        ckd_calloc_2d(acmod->n_mfc_alloc, acmod->fcb->cepsize,
                      sizeof(**acmod->mfc_buf));

    /* Feature buffer has to be at least as large as MFCC buffer. */
    acmod->n_feat_alloc = acmod->n_mfc_alloc + ps_config_int(acmod->config, "pl_window");
    if (acmod->feat_buf)
        feat_array_free(acmod->feat_buf);
    acmod->feat_buf = feat_array_alloc(acmod->fcb, acmod->n_feat_alloc);
    if (acmod->framepos)
        ckd_free(acmod->framepos);
    acmod->framepos = ckd_calloc(acmod->n_feat_alloc, sizeof(*acmod->framepos));

    return 0;
}